

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetlinecontrol.cpp
# Opt level: O1

void __thiscall QWidgetLineControl::parseInputMask(QWidgetLineControl *this,QString *maskFields)

{
  ushort uVar1;
  QArrayData *pQVar2;
  char16_t *pcVar3;
  qsizetype qVar4;
  void *pvVar5;
  long lVar6;
  char16_t cVar7;
  qsizetype n;
  void *pvVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  bool bVar14;
  undefined4 uVar15;
  long lVar16;
  undefined1 uVar17;
  long in_FS_OFFSET;
  QString local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.d.ptr = (maskFields->d).ptr;
  local_48.d.d = (Data *)(maskFields->d).size;
  n = QStringView::indexOf((QStringView *)&local_48,(QChar)0x3b,0,CaseSensitive);
  if ((n == 0) || ((maskFields->d).size == 0)) {
    pvVar8 = *(void **)(this + 0xe8);
    if (pvVar8 != (void *)0x0) {
      *(undefined8 *)(this + 0xe8) = 0;
      operator_delete__(pvVar8);
      *(undefined4 *)(this + 0x60) = 0x7fff;
      local_48.d.size = 0;
      local_48.d.d = (Data *)0x0;
      local_48.d.ptr = (char16_t *)0x0;
      internalSetText(this,&local_48,-1,false);
      if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
  }
  else {
    if (n == -1) {
      *(undefined2 *)(this + 0xe0) = 0x20;
      QString::operator=((QString *)(this + 200),(QString *)maskFields);
    }
    else {
      QString::left(&local_48,maskFields,n);
      pQVar2 = *(QArrayData **)(this + 200);
      pcVar3 = *(char16_t **)(this + 0xd0);
      *(Data **)(this + 200) = local_48.d.d;
      *(char16_t **)(this + 0xd0) = local_48.d.ptr;
      qVar4 = *(qsizetype *)(this + 0xd8);
      *(qsizetype *)(this + 0xd8) = local_48.d.size;
      local_48.d.d = (Data *)pQVar2;
      local_48.d.ptr = pcVar3;
      local_48.d.size = qVar4;
      if (pQVar2 != (QArrayData *)0x0) {
        LOCK();
        (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar2,2,0x10);
        }
      }
      cVar7 = L' ';
      if (n + 1 < (maskFields->d).size) {
        cVar7 = (maskFields->d).ptr[n + 1];
      }
      *(char16_t *)(this + 0xe0) = cVar7;
    }
    *(undefined4 *)(this + 0x60) = 0;
    if (*(long *)(this + 0xd8) != 0) {
      iVar9 = *(int *)(this + 0x60);
      lVar11 = 0;
      bVar14 = false;
      do {
        if (bVar14) {
          iVar9 = iVar9 + 1;
          *(int *)(this + 0x60) = iVar9;
          bVar14 = false;
        }
        else {
          uVar1 = *(ushort *)(*(long *)(this + 0xd0) + lVar11 * 2);
          uVar13 = (ulong)(uVar1 - 0x21);
          if (uVar1 - 0x21 < 0x3d) {
            if ((0x400000028000001U >> (uVar13 & 0x3f) & 1) == 0) {
              if (uVar13 == 0x3b) {
                bVar14 = true;
              }
              else if (uVar13 != 0x3c) goto LAB_0042d683;
            }
          }
          else {
LAB_0042d683:
            if ((uVar1 != 0x7b) && (uVar1 != 0x7d)) {
              iVar9 = iVar9 + 1;
              *(int *)(this + 0x60) = iVar9;
            }
          }
        }
        lVar11 = lVar11 + 1;
      } while (*(long *)(this + 0xd8) != lVar11);
    }
    lVar11 = (long)*(int *)(this + 0x60);
    uVar13 = 0xffffffffffffffff;
    if (-1 < lVar11) {
      uVar13 = lVar11 * 8;
    }
    pvVar8 = operator_new__(uVar13);
    if (lVar11 != 0) {
      lVar10 = 0;
      do {
        *(undefined8 *)((long)pvVar8 + lVar10) = 0;
        *(undefined2 *)((long)pvVar8 + lVar10) = 0;
        lVar10 = lVar10 + 8;
      } while (lVar11 * 8 - lVar10 != 0);
    }
    pvVar5 = *(void **)(this + 0xe8);
    *(void **)(this + 0xe8) = pvVar8;
    if (pvVar5 != (void *)0x0) {
      operator_delete__(pvVar5);
    }
    lVar11 = *(long *)(this + 0xd8);
    if (lVar11 != 0) {
      lVar10 = *(long *)(this + 0xd0);
      lVar6 = *(long *)(this + 0xe8);
      lVar12 = 0;
      iVar9 = 0;
      bVar14 = false;
      uVar15 = 0;
      do {
        uVar1 = *(ushort *)(lVar10 + lVar12 * 2);
        if (bVar14) {
          if (lVar6 != 0) {
            lVar16 = (long)iVar9;
            *(ushort *)(lVar6 + lVar16 * 8) = uVar1;
            *(undefined1 *)(lVar6 + 2 + lVar16 * 8) = 1;
            *(undefined4 *)(lVar6 + 4 + lVar16 * 8) = uVar15;
            iVar9 = iVar9 + 1;
            bVar14 = false;
            goto switchD_0042d7aa_caseD_5b;
          }
          parseInputMask();
LAB_0042d849:
          parseInputMask();
          goto LAB_0042d84e;
        }
        uVar17 = 0;
        if (uVar1 < 0x5b) {
          uVar13 = (ulong)(uVar1 - 0x23);
          if (uVar1 - 0x23 < 0x36) {
            if ((0x200822c0402001U >> (uVar13 & 0x3f) & 1) != 0) goto switchD_0042d7aa_caseD_61;
            if (uVar13 == 0x19) {
              uVar15 = 2;
            }
            else {
              if (uVar13 != 0x1b) goto LAB_0042d7f4;
              uVar15 = 1;
            }
          }
          else {
LAB_0042d7f4:
            if (uVar1 != 0x21) goto switchD_0042d7aa_caseD_5e;
            uVar15 = 0;
          }
        }
        else if (uVar1 < 0x78) {
          switch(uVar1) {
          case 0x5b:
          case 0x5d:
            goto switchD_0042d7aa_caseD_5b;
          case 0x5c:
            uVar17 = 1;
            bVar14 = true;
            break;
          default:
switchD_0042d7aa_caseD_5e:
            uVar17 = 1;
            break;
          case 0x61:
          case 0x62:
          case 100:
          case 0x68:
          case 0x6e:
            break;
          }
switchD_0042d7aa_caseD_61:
          if (!bVar14) {
            if (lVar6 == 0) goto LAB_0042d849;
            lVar16 = (long)iVar9;
            *(ushort *)(lVar6 + lVar16 * 8) = uVar1;
            *(undefined1 *)(lVar6 + 2 + lVar16 * 8) = uVar17;
            *(undefined4 *)(lVar6 + 4 + lVar16 * 8) = uVar15;
            iVar9 = iVar9 + 1;
          }
        }
        else {
          if (uVar1 == 0x78) goto switchD_0042d7aa_caseD_61;
          if ((uVar1 != 0x7b) && (uVar1 != 0x7d)) goto switchD_0042d7aa_caseD_5e;
        }
switchD_0042d7aa_caseD_5b:
        lVar12 = lVar12 + 1;
      } while (lVar11 != lVar12);
    }
    internalSetText(this,(QString *)(this + 0x18),-1,false);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
LAB_0042d84e:
  __stack_chk_fail();
}

Assistant:

void QWidgetLineControl::parseInputMask(const QString &maskFields)
{
    qsizetype delimiter = maskFields.indexOf(u';');
    if (maskFields.isEmpty() || delimiter == 0) {
        if (m_maskData) {
            m_maskData.reset();
            m_maxLength = 32767;
            internalSetText(QString(), -1, false);
        }
        return;
    }

    if (delimiter == -1) {
        m_blank = u' ';
        m_inputMask = maskFields;
    } else {
        m_inputMask = maskFields.left(delimiter);
        m_blank = (delimiter + 1 < maskFields.size()) ? maskFields[delimiter + 1] : u' ';
    }

    // calculate m_maxLength / m_maskData length
    m_maxLength = 0;
    bool escaped = false;
    for (int i=0; i<m_inputMask.size(); i++) {
        const auto c = m_inputMask.at(i);
        if (escaped) {
           ++m_maxLength;
           escaped = false;
           continue;
        }

        if (c == u'\\') {
           escaped = true;
           continue;
        }

        if (c != u'\\' && c != u'!' && c != u'<' && c != u'>' &&
             c != u'{' && c != u'}' && c != u'[' && c != u']')
            m_maxLength++;
    }

    m_maskData = std::make_unique<MaskInputData[]>(m_maxLength);

    MaskInputData::Casemode m = MaskInputData::NoCaseMode;
    bool s;
    bool escape = false;
    int index = 0;
    for (int i = 0; i < m_inputMask.size(); i++) {
        const auto c = m_inputMask.at(i);
        if (escape) {
            s = true;
            m_maskData[index].maskChar = c;
            m_maskData[index].separator = s;
            m_maskData[index].caseMode = m;
            index++;
            escape = false;
        } else if (c == u'<') {
            m = MaskInputData::Lower;
        } else if (c == u'>') {
            m = MaskInputData::Upper;
        } else if (c == u'!') {
            m = MaskInputData::NoCaseMode;
        } else if (c != u'{' && c != u'}' && c != u'[' && c != u']') {
            switch (c.unicode()) {
            case 'A':
            case 'a':
            case 'N':
            case 'n':
            case 'X':
            case 'x':
            case '9':
            case '0':
            case 'D':
            case 'd':
            case '#':
            case 'H':
            case 'h':
            case 'B':
            case 'b':
                s = false;
                break;
            case '\\':
                escape = true;
                Q_FALLTHROUGH();
            default:
                s = true;
                break;
            }

            if (!escape) {
                m_maskData[index].maskChar = c;
                m_maskData[index].separator = s;
                m_maskData[index].caseMode = m;
                index++;
            }
        }
    }
    internalSetText(m_text, -1, false);
}